

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O0

FT_Error tt_size_run_fpgm(TT_Size size,FT_Bool pedantic)

{
  TT_Face face_00;
  TT_ExecContext exec_00;
  TT_Size_Metrics *tt_metrics;
  FT_Size_Metrics *size_metrics;
  FT_Error error;
  TT_ExecContext exec;
  TT_Face face;
  FT_Bool pedantic_local;
  TT_Size size_local;
  
  face_00 = (TT_Face)(size->root).face;
  exec_00 = size->context;
  size_local._4_4_ = TT_Load_Context(exec_00,face_00,size);
  if (size_local._4_4_ == 0) {
    exec_00->callTop = 0;
    exec_00->top = 0;
    exec_00->period = 0x40;
    exec_00->phase = 0;
    exec_00->threshold = 0;
    exec_00->instruction_trap = '\0';
    exec_00->F_dot_P = 0x4000;
    exec_00->pedantic_hinting = pedantic;
    (exec_00->metrics).x_ppem = 0;
    (exec_00->metrics).y_ppem = 0;
    (exec_00->metrics).x_scale = 0;
    (exec_00->metrics).y_scale = 0;
    (exec_00->tt_metrics).ppem = 0;
    (exec_00->tt_metrics).scale = 0;
    (exec_00->tt_metrics).ratio = 0x10000;
    TT_Set_CodeRange(exec_00,1,face_00->font_program,face_00->font_program_size);
    TT_Clear_CodeRange(exec_00,2);
    TT_Clear_CodeRange(exec_00,3);
    if (face_00->font_program_size == 0) {
      size_metrics._4_4_ = 0;
    }
    else {
      TT_Goto_CodeRange(exec_00,1,0);
      size_metrics._4_4_ = (*face_00->interpreter)(exec_00);
    }
    size->bytecode_ready = size_metrics._4_4_;
    if (size_metrics._4_4_ == 0) {
      TT_Save_Context(exec_00,size);
    }
    size_local._4_4_ = size_metrics._4_4_;
  }
  return size_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_run_fpgm( TT_Size  size,
                    FT_Bool  pedantic )
  {
    TT_Face         face = (TT_Face)size->root.face;
    TT_ExecContext  exec;
    FT_Error        error;


    exec = size->context;

    error = TT_Load_Context( exec, face, size );
    if ( error )
      return error;

    exec->callTop = 0;
    exec->top     = 0;

    exec->period    = 64;
    exec->phase     = 0;
    exec->threshold = 0;

    exec->instruction_trap = FALSE;
    exec->F_dot_P          = 0x4000L;

    exec->pedantic_hinting = pedantic;

    {
      FT_Size_Metrics*  size_metrics = &exec->metrics;
      TT_Size_Metrics*  tt_metrics   = &exec->tt_metrics;


      size_metrics->x_ppem   = 0;
      size_metrics->y_ppem   = 0;
      size_metrics->x_scale  = 0;
      size_metrics->y_scale  = 0;

      tt_metrics->ppem  = 0;
      tt_metrics->scale = 0;
      tt_metrics->ratio = 0x10000L;
    }

    /* allow font program execution */
    TT_Set_CodeRange( exec,
                      tt_coderange_font,
                      face->font_program,
                      (FT_Long)face->font_program_size );

    /* disable CVT and glyph programs coderange */
    TT_Clear_CodeRange( exec, tt_coderange_cvt );
    TT_Clear_CodeRange( exec, tt_coderange_glyph );

    if ( face->font_program_size > 0 )
    {
      TT_Goto_CodeRange( exec, tt_coderange_font, 0 );

      FT_TRACE4(( "Executing `fpgm' table.\n" ));
      error = face->interpreter( exec );
#ifdef FT_DEBUG_LEVEL_TRACE
      if ( error )
        FT_TRACE4(( "  interpretation failed with error code 0x%x\n",
                    error ));
#endif
    }
    else
      error = FT_Err_Ok;

    size->bytecode_ready = error;

    if ( !error )
      TT_Save_Context( exec, size );

    return error;
  }